

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::RemoveBlockRequest
          (PeerManagerImpl *this,uint256 *hash,optional<long> from_peer)

{
  long lVar1;
  bool bVar2;
  type_conflict6 *file;
  type *ptVar3;
  long *plVar4;
  CNodeState **ppCVar5;
  duration<long,_std::ratio<1L,_1000000L>_> *pdVar6;
  microseconds mVar7;
  CNodeState **in_RSI;
  PeerManagerImpl *in_RDI;
  long in_FS_OFFSET;
  CNodeState *state;
  type *list_it;
  type_conflict6 *node_id;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  range;
  pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *in_stack_ffffffffffffff38;
  microseconds *in_stack_ffffffffffffff40;
  iterator in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  _Self in_stack_ffffffffffffff60;
  int line;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  ::equal_range((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                 *)in_RDI,(key_type *)in_stack_ffffffffffffff40);
  bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff40);
  if (!bVar2) {
    std::
    multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
    ::count((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
             *)in_RDI,(key_type *)in_stack_ffffffffffffff40);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_ffffffffffffff58._M_node,(char *)in_stack_ffffffffffffff50._M_node,
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffff40,
               (char *)in_stack_ffffffffffffff38);
    while (bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff40),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                    *)in_stack_ffffffffffffff38);
      file = std::get<0ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                       (in_stack_ffffffffffffff38);
      ptVar3 = std::get<1ul,long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>
                         (in_stack_ffffffffffffff38);
      line = (int)((ulong)ptVar3 >> 0x20);
      bVar2 = std::optional::operator_cast_to_bool((optional<long> *)in_stack_ffffffffffffff38);
      if ((bVar2) &&
         (plVar4 = std::optional<long>::operator*((optional<long> *)in_stack_ffffffffffffff38),
         *plVar4 != *file)) {
        in_stack_ffffffffffffff60 =
             std::
             _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
             ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
                           *)in_stack_ffffffffffffff50._M_node,(int)((ulong)in_RDI >> 0x20));
      }
      else {
        State(in_RDI,(NodeId)in_stack_ffffffffffffff40);
        ppCVar5 = inline_assertion_check<true,(anonymous_namespace)::CNodeState*>
                            (in_RSI,(char *)file,line,(char *)in_stack_ffffffffffffff60._M_node,
                             (char *)in_stack_ffffffffffffff58._M_node);
        in_stack_ffffffffffffff58._M_node = (_Base_ptr)*ppCVar5;
        std::__cxx11::
        list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
        ::begin((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                 *)in_stack_ffffffffffffff40);
        bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff40);
        if (bVar2) {
          in_stack_ffffffffffffff40 =
               &((CNodeState *)in_stack_ffffffffffffff58._M_node)->m_downloading_since;
          GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
          pdVar6 = std::max<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                             ((duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI,
                              (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff40
                             );
          (((CNodeState *)in_stack_ffffffffffffff58._M_node)->m_downloading_since).__r = pdVar6->__r
          ;
        }
        in_stack_ffffffffffffff38 =
             (pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_> *)
             &((CNodeState *)in_stack_ffffffffffffff58._M_node)->vBlocksInFlight;
        std::_List_const_iterator<(anonymous_namespace)::QueuedBlock>::_List_const_iterator
                  ((_List_const_iterator<(anonymous_namespace)::QueuedBlock> *)
                   in_stack_ffffffffffffff38,(iterator *)0x10830a5);
        in_stack_ffffffffffffff50 =
             std::__cxx11::
             list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
             ::erase((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                      *)in_RDI,in_stack_ffffffffffffff50._M_node);
        bVar2 = std::__cxx11::
                list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                ::empty((list<(anonymous_namespace)::QueuedBlock,_std::allocator<(anonymous_namespace)::QueuedBlock>_>
                         *)in_stack_ffffffffffffff38);
        if (bVar2) {
          in_RDI->m_peers_downloading_from = in_RDI->m_peers_downloading_from + -1;
        }
        mVar7 = us<(char)48>();
        *(rep *)(in_stack_ffffffffffffff58._M_node + 2) = mVar7.__r;
        std::
        multimap<uint256,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,std::_List_iterator<(anonymous_namespace)::QueuedBlock>>>>>
        ::erase_abi_cxx11_((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                            *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::RemoveBlockRequest(const uint256& hash, std::optional<NodeId> from_peer)
{
    auto range = mapBlocksInFlight.equal_range(hash);
    if (range.first == range.second) {
        // Block was not requested from any peer
        return;
    }

    // We should not have requested too many of this block
    Assume(mapBlocksInFlight.count(hash) <= MAX_CMPCTBLOCKS_INFLIGHT_PER_BLOCK);

    while (range.first != range.second) {
        auto [node_id, list_it] = range.first->second;

        if (from_peer && *from_peer != node_id) {
            range.first++;
            continue;
        }

        CNodeState& state = *Assert(State(node_id));

        if (state.vBlocksInFlight.begin() == list_it) {
            // First block on the queue was received, update the start download time for the next one
            state.m_downloading_since = std::max(state.m_downloading_since, GetTime<std::chrono::microseconds>());
        }
        state.vBlocksInFlight.erase(list_it);

        if (state.vBlocksInFlight.empty()) {
            // Last validated block on the queue for this peer was received.
            m_peers_downloading_from--;
        }
        state.m_stalling_since = 0us;

        range.first = mapBlocksInFlight.erase(range.first);
    }
}